

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixy-fwd.c
# Opt level: O1

void forward(ixy_device *rx_dev,uint16_t rx_queue,ixy_device *tx_dev,uint16_t tx_queue)

{
  char *pcVar1;
  uint32_t uVar2;
  uint uVar3;
  ulong uVar4;
  undefined6 in_register_00000032;
  pkt_buf *local_118 [32];
  
  uVar2 = (*rx_dev->rx_batch)(rx_dev,0,local_118,0x20);
  if (uVar2 != 0) {
    uVar4 = 0;
    do {
      pcVar1 = (char *)((long)&local_118[uVar4][1].buf_addr_phy + 1);
      *pcVar1 = *pcVar1 + '\x01';
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
    uVar3 = (**(code **)(CONCAT62(in_register_00000032,rx_queue) + 0x20))
                      (CONCAT62(in_register_00000032,rx_queue),0,local_118,uVar2);
    if (uVar3 < uVar2) {
      uVar4 = (ulong)uVar3;
      do {
        pkt_buf_free(local_118[uVar4]);
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
  }
  return;
}

Assistant:

static void forward(struct ixy_device* rx_dev, uint16_t rx_queue, struct ixy_device* tx_dev, uint16_t tx_queue) {
	struct pkt_buf* bufs[BATCH_SIZE];
	uint32_t num_rx = ixy_rx_batch(rx_dev, rx_queue, bufs, BATCH_SIZE);
	if (num_rx > 0) {
		// touch all packets, otherwise it's a completely unrealistic workload if the packet just stays in L3
		for (uint32_t i = 0; i < num_rx; i++) {
			bufs[i]->data[1]++;
		}
		uint32_t num_tx = ixy_tx_batch(tx_dev, tx_queue, bufs, num_rx);
		// there are two ways to handle the case that packets are not being sent out:
		// either wait on tx or drop them; in this case it's better to drop them, otherwise we accumulate latency
		for (uint32_t i = num_tx; i < num_rx; i++) {
			pkt_buf_free(bufs[i]);
		}
	}
}